

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLineArguments.cxx
# Opt level: O0

void __thiscall
cmsys::CommandLineArguments::PopulateVariable
          (CommandLineArguments *this,double *variable,string *value)

{
  char *__nptr;
  double dVar1;
  char *local_28;
  char *res;
  string *value_local;
  double *variable_local;
  CommandLineArguments *this_local;
  
  local_28 = (char *)0x0;
  res = (char *)value;
  value_local = (string *)variable;
  variable_local = (double *)this;
  __nptr = (char *)std::__cxx11::string::c_str();
  dVar1 = strtod(__nptr,&local_28);
  *(double *)value_local = dVar1;
  return;
}

Assistant:

void CommandLineArguments::PopulateVariable(double* variable,
                                            const std::string& value)
{
  char* res = KWSYS_NULLPTR;
  *variable = strtod(value.c_str(), &res);
  // if ( res && *res )
  //  {
  //  Can handle non-double
  //  }
}